

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<arg_res_tuple<float,_1UL>_>::populate
          (Generators<arg_res_tuple<float,_1UL>_> *this,arg_res_tuple<float,_1UL> *val)

{
  IGenerator<arg_res_tuple<float,_1UL>_> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<arg_res_tuple<float,_1UL>_>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  value<arg_res_tuple<float,1ul>>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>>
            ((vector<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>,std::allocator<Catch::Generators::GeneratorWrapper<arg_res_tuple<float,1ul>>>>
              *)&this->m_generators,(GeneratorWrapper<arg_res_tuple<float,_1UL>_> *)&local_18);
  if (local_18._M_head_impl != (IGenerator<arg_res_tuple<float,_1UL>_> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }